

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
         *this)

{
  FloatFormat *pFVar1;
  double *pdVar2;
  bool *pbVar3;
  qpTestLog *pqVar4;
  bool *pbVar5;
  ostringstream *poVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  Precision PVar9;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar10;
  Statement *pSVar11;
  ShaderExecutor *pSVar12;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar13;
  pointer pcVar14;
  double dVar15;
  undefined8 uVar16;
  pointer pMVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  _Rb_tree_node_base *p_Var21;
  Interval *pIVar22;
  IVal *pIVar23;
  MessageBuilder *pMVar24;
  undefined8 *puVar25;
  float *ival;
  undefined1 *puVar26;
  Matrix<float,_4,_4> *val;
  int row;
  long lVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  char *pcVar32;
  TestLog TVar33;
  TestLog *pTVar34;
  Interval *__return_storage_ptr___00;
  IVal in2;
  IVal in3;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  outputs;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  FuncSet funcs;
  IVal in0;
  IVal in1;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff7d8;
  string local_818;
  TestLog *local_7f8;
  size_t local_7f0;
  string local_7e8;
  TestStatus *local_7c8;
  FloatFormat *local_7c0;
  FloatFormat local_7b8;
  ulong local_790;
  long local_788;
  long local_780;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_778;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  local_748;
  pointer local_718;
  pointer local_710;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_708;
  pointer local_6a8;
  pointer local_6a0;
  pointer local_698;
  pointer local_690;
  undefined1 local_688 [12];
  YesNoMaybe YStack_67c;
  TestLog local_678;
  _Rb_tree_node_base *p_Stack_670;
  _Rb_tree_node_base *local_668;
  double local_660;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_658;
  undefined4 local_650;
  ios_base local_610 [272];
  undefined1 local_500 [16];
  TestLog local_4f0 [12];
  ios_base local_490 [8];
  ios_base local_488 [264];
  undefined1 local_380 [16];
  undefined1 local_370 [376];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [384];
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar9 = (this->m_caseCtx).precision;
  sVar10 = (this->m_caseCtx).numRandoms;
  local_7c8 = __return_storage_ptr__;
  iVar20 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_7c0 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,4,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_708,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar9,(Precision)sVar10,(ulong)(iVar20 + 0xdeadbeef),
             in_stack_fffffffffffff7d8);
  pMVar17 = local_708.in0.
            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_7f0 = (long)local_708.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_708.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>::
  Outputs(&local_748,local_7f0);
  local_7b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_7b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_7b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_7b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_7b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_7b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_7b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_7b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_7b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_778._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_778._M_impl.super__Rb_tree_header._M_header;
  local_778._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_778._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_778._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_778._M_impl.super__Rb_tree_header._M_header._M_right =
       local_778._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector((ResultCollector *)(local_370 + 0x170));
  local_7f8 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_6a8 = local_708.in0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_6a0 = local_708.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_698 = local_708.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_690 = local_708.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_718 = local_748.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_710 = local_748.out1.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar6 = (ostringstream *)(local_500 + 8);
  local_500._0_8_ = local_7f8;
  std::__cxx11::ostringstream::ostringstream(poVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar6,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar6);
  std::ios_base::~ios_base(local_488);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  p_Var7 = (_Rb_tree_node_base *)(local_688 + 8);
  local_688._8_4_ = _S_red;
  local_678.m_log = (qpTestLog *)0x0;
  local_660 = 0.0;
  pSVar11 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  p_Stack_670 = p_Var7;
  local_668 = p_Var7;
  (*pSVar11->_vptr_Statement[4])(pSVar11,local_688);
  if (p_Stack_670 != p_Var7) {
    p_Var21 = p_Stack_670;
    do {
      (**(code **)(**(long **)(p_Var21 + 1) + 0x30))(*(long **)(p_Var21 + 1),local_1b0);
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
    } while (p_Var21 != p_Var7);
  }
  if (local_660 != 0.0) {
    poVar6 = (ostringstream *)(local_500 + 8);
    local_500._0_8_ = local_7f8;
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar6,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar6,(char *)local_380._0_8_,local_380._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_380._0_8_ != local_370) {
      operator_delete((void *)local_380._0_8_,local_370._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar6);
    std::ios_base::~ios_base(local_488);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_688);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  pSVar12 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  ival = (float *)&local_718;
  (*pSVar12->_vptr_ShaderExecutor[2])(pSVar12,local_7f0,&local_6a8,ival,0);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_500);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_1b0);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_688);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_778,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_500);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_778,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_380);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_778,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_818);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_778,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_7e8);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_778,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_1b0);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_778,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_688);
  if (local_708.in0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar17) {
    iVar20 = 0;
  }
  else {
    local_788 = local_7f0 + (local_7f0 == 0);
    lVar28 = 0;
    uVar30 = 0;
    do {
      __return_storage_ptr___00 = (Interval *)local_688;
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_500);
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_1b0);
      pFVar1 = local_7c0;
      round<tcu::Matrix<float,4,4>>
                ((IVal *)local_380,(shaderexecutor *)local_7c0,
                 (FloatFormat *)
                 (local_708.in0.
                  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar28),(Matrix<float,_4,_4> *)ival);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)__return_storage_ptr___00,pFVar1,(IVal *)local_380);
      pIVar22 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_778,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      pFVar1 = local_7c0;
      lVar27 = 0;
      do {
        lVar31 = 0;
        do {
          *(undefined8 *)((long)&pIVar22->m_hi + lVar31) =
               *(undefined8 *)((long)&__return_storage_ptr___00->m_hi + lVar31);
          pbVar5 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)
                    &__return_storage_ptr___00->m_hasNaN)->m_data[0].m_data[0].m_hasNaN + lVar31;
          dVar15 = *(double *)(pbVar5 + 8);
          pbVar3 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar22->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar31;
          *(undefined8 *)pbVar3 = *(undefined8 *)pbVar5;
          *(double *)(pbVar3 + 8) = dVar15;
          lVar31 = lVar31 + 0x60;
        } while (lVar31 != 0x180);
        lVar27 = lVar27 + 1;
        pIVar22 = pIVar22 + 1;
        __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
      } while (lVar27 != 4);
      local_780 = lVar28;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_778,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_778,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_778,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_668 = (_Rb_tree_node_base *)pFVar1->m_maxValue;
      local_688._0_8_ = *(undefined8 *)pFVar1;
      local_688._8_4_ = pFVar1->m_fractionBits;
      YStack_67c = pFVar1->m_hasSubnormal;
      local_678.m_log = *(qpTestLog **)&pFVar1->m_hasInf;
      p_Stack_670 = *(_Rb_tree_node_base **)&pFVar1->m_exactPrecision;
      local_660 = (double)CONCAT44(local_660._4_4_,(this->m_caseCtx).precision);
      local_650 = 0;
      pSVar11 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_658 = &local_778;
      (*pSVar11->_vptr_Statement[3])(pSVar11,local_688);
      pIVar23 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_778,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_688,&local_7b8,pIVar23);
      puVar26 = local_1b0;
      lVar27 = 0;
      pMVar24 = (MessageBuilder *)local_688;
      do {
        lVar31 = 0;
        do {
          *(undefined8 *)(puVar26 + lVar31 + 0x10) = *(undefined8 *)(&pMVar24->field_0x10 + lVar31);
          puVar25 = (undefined8 *)((long)&pMVar24->m_log + lVar31);
          uVar16 = puVar25[1];
          *(undefined8 *)(puVar26 + lVar31) = *puVar25;
          *(undefined8 *)((long)(puVar26 + lVar31) + 8) = uVar16;
          lVar31 = lVar31 + 0x60;
        } while (lVar31 != 0x180);
        lVar27 = lVar27 + 1;
        puVar26 = puVar26 + 0x18;
        pMVar24 = (MessageBuilder *)&pMVar24->field_0x18;
      } while (lVar27 != 4);
      bVar18 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_1b0,
                          local_748.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar28);
      local_688._0_8_ = &local_678;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_688,"Shader output 1 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check
                         ((ResultCollector *)(local_370 + 0x170),bVar18,(string *)local_688);
      if ((TestLog *)local_688._0_8_ != &local_678) {
        operator_delete((void *)local_688._0_8_,(ulong)((long)&(local_678.m_log)->flags + 1));
      }
      pIVar23 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_778,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_688,&local_7b8,pIVar23);
      ival = (float *)local_500;
      lVar27 = 0;
      pMVar24 = (MessageBuilder *)local_688;
      do {
        lVar31 = 0;
        do {
          *(undefined8 *)((long)ival + lVar31 + 0x10) =
               *(undefined8 *)(&pMVar24->field_0x10 + lVar31);
          puVar25 = (undefined8 *)((long)&pMVar24->m_log + lVar31);
          uVar16 = puVar25[1];
          *(undefined8 *)((long)ival + lVar31) = *puVar25;
          ((undefined8 *)((long)ival + lVar31))[1] = uVar16;
          lVar31 = lVar31 + 0x60;
        } while (lVar31 != 0x180);
        lVar27 = lVar27 + 1;
        ival = ival + 6;
        pMVar24 = (MessageBuilder *)&pMVar24->field_0x18;
      } while (lVar27 != 4);
      bVar19 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_500,
                          local_748.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar28);
      local_688._0_8_ = &local_678;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_688,"Shader output 0 is outside acceptable range","");
      bVar19 = tcu::ResultCollector::check
                         ((ResultCollector *)(local_370 + 0x170),bVar19,(string *)local_688);
      if ((TestLog *)local_688._0_8_ != &local_678) {
        operator_delete((void *)local_688._0_8_,(ulong)((long)&(local_678.m_log)->flags + 1));
      }
      uVar29 = (int)uVar30 + ((byte)~(bVar18 && bVar19) & 1);
      uVar30 = (ulong)uVar29;
      if ((int)uVar29 < 0x65 && (!bVar18 || !bVar19)) {
        local_688._0_8_ = local_7f8;
        poVar6 = (ostringstream *)(local_688 + 8);
        local_790 = (ulong)uVar29;
        std::__cxx11::ostringstream::ostringstream(poVar6);
        pcVar32 = "Failed";
        if (bVar18 && bVar19) {
          pcVar32 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,pcVar32,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"\t",1);
        pVVar13 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.
                  m_ptr;
        val = (Matrix<float,_4,_4> *)local_370;
        pcVar14 = (pVVar13->m_name)._M_dataplus._M_p;
        local_380._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_380,pcVar14,pcVar14 + (pVVar13->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_688 + 8),(char *)local_380._0_8_,local_380._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_688 + 8)," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_818,(shaderexecutor *)&local_7b8,
                   (FloatFormat *)
                   (local_708.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_688 + 8),local_818._M_dataplus._M_p,local_818._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_688 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_818._M_dataplus._M_p != &local_818.field_2) {
          operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_4,_4> *)local_380._0_8_ != (Matrix<float,_4,_4> *)local_370) {
          operator_delete((void *)local_380._0_8_,local_370._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_688 + 8),"\t",1);
        pVVar13 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.
                  m_ptr;
        pIVar23 = (IVal *)local_370;
        pcVar14 = (pVVar13->m_name)._M_dataplus._M_p;
        local_380._0_8_ = pIVar23;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_380,pcVar14,pcVar14 + (pVVar13->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_688 + 8),(char *)local_380._0_8_,local_380._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_688 + 8)," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_818,(shaderexecutor *)&local_7b8,
                   (FloatFormat *)
                   (local_748.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),
                   (Matrix<float,_4,_4> *)pIVar23);
        poVar8 = (ostream *)(local_688 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_818._M_dataplus._M_p,local_818._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_7e8,(shaderexecutor *)&local_7b8,(FloatFormat *)local_500,pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_688 + 8),local_7e8._M_dataplus._M_p,local_7e8._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_688 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_818._M_dataplus._M_p != &local_818.field_2) {
          operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_380._0_8_ != (IVal *)local_370) {
          operator_delete((void *)local_380._0_8_,local_370._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_688 + 8),"\t",1);
        pVVar13 = (this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.
                  m_ptr;
        ival = (float *)local_370;
        pcVar14 = (pVVar13->m_name)._M_dataplus._M_p;
        local_380._0_8_ = ival;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_380,pcVar14,pcVar14 + (pVVar13->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_688 + 8),(char *)local_380._0_8_,local_380._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_688 + 8)," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_818,(shaderexecutor *)&local_7b8,
                   (FloatFormat *)
                   (local_748.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),(Matrix<float,_4,_4> *)ival)
        ;
        poVar8 = (ostream *)(local_688 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_818._M_dataplus._M_p,local_818._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_7e8,(shaderexecutor *)&local_7b8,(FloatFormat *)local_1b0,(IVal *)ival);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_7e8._M_dataplus._M_p,local_7e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_818._M_dataplus._M_p != &local_818.field_2) {
          operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_380._0_8_ != local_370) {
          operator_delete((void *)local_380._0_8_,local_370._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_688,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_688 + 8));
        std::ios_base::~ios_base(local_610);
        uVar30 = local_790;
      }
      iVar20 = (int)uVar30;
      lVar28 = local_780 + 1;
    } while (lVar28 != local_788);
  }
  if (100 < iVar20) {
    poVar6 = (ostringstream *)(local_500 + 8);
    local_500._0_8_ = local_7f8;
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"(Skipped ",9);
    std::ostream::operator<<(poVar6,iVar20 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar6);
    std::ios_base::~ios_base(local_488);
  }
  poVar6 = (ostringstream *)(local_500 + 8);
  if (iVar20 == 0) {
    local_500._0_8_ = local_7f8;
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_500._0_8_ = local_7f8;
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::ostream::operator<<(poVar6,iVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar6);
  std::ios_base::~ios_base(local_488);
  if (iVar20 == 0) {
    local_500._0_8_ = local_4f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"Pass","");
    local_7c8->m_code = QP_TEST_RESULT_PASS;
    (local_7c8->m_description)._M_dataplus._M_p = (pointer)&(local_7c8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7c8->m_description,local_500._0_8_,
               (long)(qpTestLog **)local_500._0_8_ + local_500._8_8_);
    pTVar34 = (TestLog *)local_500._0_8_;
    if ((TestLog *)local_500._0_8_ == local_4f0) goto LAB_0093e8f9;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    std::ostream::operator<<(local_500,iVar20);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    std::ios_base::~ios_base(local_490);
    local_500._0_8_ = local_4f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_500," test failed. Check log for the details","");
    pqVar4 = (qpTestLog *)(local_500._8_8_ + CONCAT44(YStack_67c,local_688._8_4_));
    TVar33.m_log = (qpTestLog *)0xf;
    if ((TestLog *)local_688._0_8_ != &local_678) {
      TVar33.m_log = local_678.m_log;
    }
    if (TVar33.m_log < pqVar4) {
      TVar33.m_log = (qpTestLog *)0xf;
      if ((TestLog *)local_500._0_8_ != local_4f0) {
        TVar33.m_log = local_4f0[0].m_log;
      }
      if (TVar33.m_log < pqVar4) goto LAB_0093e77d;
      puVar25 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_500,0,(char *)0x0,local_688._0_8_);
    }
    else {
LAB_0093e77d:
      puVar25 = (undefined8 *)std::__cxx11::string::_M_append(local_688,local_500._0_8_);
    }
    local_1b0._0_8_ = local_1b0 + 0x10;
    pdVar2 = (double *)(puVar25 + 2);
    if ((double *)*puVar25 == pdVar2) {
      local_1b0._16_8_ = *pdVar2;
      local_1b0._24_4_ = *(undefined4 *)(puVar25 + 3);
      local_1b0._28_4_ = *(undefined4 *)((long)puVar25 + 0x1c);
    }
    else {
      local_1b0._16_8_ = *pdVar2;
      local_1b0._0_8_ = (double *)*puVar25;
    }
    local_1b0._8_8_ = puVar25[1];
    *puVar25 = pdVar2;
    puVar25[1] = 0;
    *(undefined1 *)pdVar2 = 0;
    local_7c8->m_code = QP_TEST_RESULT_FAIL;
    (local_7c8->m_description)._M_dataplus._M_p = (pointer)&(local_7c8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7c8->m_description,local_1b0._0_8_,
               (undefined1 *)(local_1b0._8_8_ + local_1b0._0_8_));
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((TestLog *)local_500._0_8_ != local_4f0) {
      operator_delete((void *)local_500._0_8_,(ulong)((long)&(local_4f0[0].m_log)->flags + 1));
    }
    local_4f0[0].m_log = local_678.m_log;
    pTVar34 = (TestLog *)local_688._0_8_;
    if ((TestLog *)local_688._0_8_ == &local_678) goto LAB_0093e8f9;
  }
  operator_delete(pTVar34,(ulong)((long)&(local_4f0[0].m_log)->flags + 1));
LAB_0093e8f9:
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0._M_allocated_capacity + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_778);
  if (local_748.out1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_748.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_748.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_748.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_748.out0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_748.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_748.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_748.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_708.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_708.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_708.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_708.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_708.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_708.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_708.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_708.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_708.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_708.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_708.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_708.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_708.in0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_708.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_708.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_708.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_7c8;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}